

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O2

void __thiscall
Qentem::Digit::realToString<double,Qentem::StringStream<char>,unsigned_long_long>
          (Digit *this,StringStream<char> *stream,unsigned_long_long number,RealFormatInfo format)

{
  SizeT started_at;
  ulong uVar1;
  char cVar2;
  bool round_up;
  SizeT32 SVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int __fd;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint length;
  SizeT32 calculated_digits;
  SizeT32 SVar11;
  bool bVar12;
  BigIntSys b_int;
  
  uVar7 = (ulong)stream & 0x7ff0000000000000;
  if (uVar7 == 0x7ff0000000000000) {
    if (((ulong)stream & 0xfffffffffffff) == 0) {
      if ((long)stream < 0) {
        StringStream<char>::operator+=((StringStream<char> *)this,'-');
      }
      __fd = 0x11c8ff;
    }
    else {
      __fd = 0x11c903;
    }
    StringStream<char>::write((StringStream<char> *)this,__fd,(void *)0x3,(size_t)format);
    return;
  }
  if ((long)stream < 0) {
    StringStream<char>::operator+=((StringStream<char> *)this,'-');
  }
  length = (uint)number;
  cVar2 = (char)(number >> 0x20);
  if (((ulong)stream & 0x7fffffffffffffff) == 0) {
    StringStream<char>::operator+=((StringStream<char> *)this,'0');
    if (cVar2 == '\x01') {
      StringStream<char>::operator+=((StringStream<char> *)this,'.');
      insertZerosLarge<Qentem::StringStream<char>>((StringStream<char> *)this,length);
      return;
    }
  }
  else {
    b_int.storage_[0] = ((ulong)stream & 0xfffffffffffff) + 0x10000000000000;
    if (uVar7 == 0) {
      b_int.storage_[0] = ((ulong)stream & 0xfffffffffffff) * 2;
    }
    SVar11 = 0;
    for (uVar1 = b_int.storage_[0]; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
      SVar11 = SVar11 + 1;
    }
    uVar8 = 0x34 - SVar11;
    b_int.storage_[9] = 0;
    b_int.storage_[10] = 0;
    uVar6 = 0;
    if (uVar7 == 0) {
      uVar6 = uVar8;
    }
    b_int.storage_[1] = 0;
    b_int.storage_[2] = 0;
    b_int.storage_[3] = 0;
    b_int.storage_[4] = 0;
    b_int.storage_[5] = 0;
    b_int.storage_[6] = 0;
    b_int.storage_[7] = 0;
    b_int.storage_[8] = 0;
    b_int.storage_[0xb] = 0;
    b_int.storage_[0xc] = 0;
    b_int.storage_[0xd] = 0;
    b_int.storage_[0xe] = 0;
    b_int.storage_[0xf] = 0;
    b_int.storage_[0x10] = 0;
    b_int.storage_[0x11] = 0;
    b_int.storage_[0x12] = 0;
    b_int.index_ = 0;
    uVar4 = (uint)(uVar7 >> 0x34);
    uVar9 = 0x3ff - uVar4;
    uVar4 = uVar4 - 0x3ff;
    uVar10 = uVar9;
    if (0x3fe0000000000000 < uVar7) {
      uVar10 = uVar4;
    }
    uVar6 = ((uVar6 + uVar10) * 0x7597) / 100000;
    bVar5 = cVar2 - 3;
    calculated_digits = uVar6 + 1;
    if ((uVar7 < 0x3fe0000000000001) || (uVar10 < uVar8 && (0xfd < bVar5 || uVar6 < length))) {
      SVar3 = calculated_digits;
      if (0x3fe0000000000000 < uVar7) {
        uVar9 = -uVar4;
        SVar3 = 0;
        if (bVar5 < 0xfe) {
          SVar3 = calculated_digits;
        }
        SVar3 = -SVar3;
      }
      uVar8 = uVar8 + uVar9;
      uVar9 = length + SVar3 + 1;
      bVar12 = uVar9 <= uVar8;
      round_up = bVar12 && uVar8 - uVar9 != 0;
      uVar6 = uVar9;
      if (!bVar12) {
        uVar6 = uVar8;
      }
      uVar8 = uVar8 - uVar9;
      if (!bVar12) {
        uVar8 = 0;
      }
      BigInt<unsigned_long_long,_1216U>::ShiftRight(&b_int,SVar11);
      uVar9 = uVar6;
      if (0x1a < uVar6) {
        if (length < 300) {
          uVar10 = (uint)(ushort)((ushort)number / 0x13 + 2);
        }
        else {
          uVar10 = 0x12;
        }
        do {
          BigInt<unsigned_long_long,_1216U>::Multiply(&b_int,0x6765c793fa10079d);
          if ((uVar10 <= b_int.index_) && (0x3f < uVar8)) {
            BigInt<unsigned_long_long,_1216U>::ShiftRight(&b_int,0x40);
            uVar8 = uVar8 - 0x40;
          }
          uVar9 = uVar9 - 0x1b;
        } while (0x1a < uVar9);
      }
      if (uVar9 != 0) {
        BigInt<unsigned_long_long,_1216U>::Multiply
                  (&b_int,*(unsigned_long_long *)
                           (DigitUtils::DigitConst<8u>::GetPowerOfFive(unsigned_int)::PowerOfFive +
                           (ulong)uVar9 * 8));
      }
      BigInt<unsigned_long_long,_1216U>::ShiftRight(&b_int,uVar8);
    }
    else {
      SVar11 = 0;
      if (0xfd >= bVar5 && uVar6 >= length) {
        SVar11 = uVar6 - length;
      }
      uVar6 = SVar11 + 0x34;
      if (uVar6 < uVar4) {
        BigInt<unsigned_long_long,_1216U>::ShiftLeft(&b_int,uVar4 - uVar6);
      }
      else {
        BigInt<unsigned_long_long,_1216U>::ShiftRight(&b_int,uVar6 - uVar4);
      }
      uVar6 = 0;
      if (SVar11 == 0) {
        round_up = false;
      }
      else {
        bigIntDropDigits<Qentem::BigInt<unsigned_long_long,1216u>>(&b_int,SVar11);
        round_up = true;
        uVar6 = 0;
      }
    }
    started_at = *(SizeT *)(this + 8);
    bigIntToString<Qentem::StringStream<char>,Qentem::BigInt<unsigned_long_long,1216u>>
              ((StringStream<char> *)this,&b_int);
    if (cVar2 == '\x01') {
      formatStringNumberFixed<true,Qentem::StringStream<char>>
                ((StringStream<char> *)this,started_at,length,calculated_digits,uVar6,round_up);
    }
    else if (((uint)(number >> 0x20) & 0xff) == 2) {
      formatStringNumberFixed<false,Qentem::StringStream<char>>
                ((StringStream<char> *)this,started_at,length,calculated_digits,uVar6,round_up);
    }
    else {
      formatStringNumberDefault<Qentem::StringStream<char>>
                ((StringStream<char> *)this,started_at,length,calculated_digits,uVar6,
                 0x3fe0000000000000 < uVar7,round_up);
    }
  }
  return;
}

Assistant:

static void realToString(Stream_T &stream, const Number_T number, const RealFormatInfo format) {
        constexpr SizeT32 number_size = sizeof(Number_T);

        using Info_T = DigitUtils::RealNumberInfo<Float_T, number_size>;
        // 4.9406564584124654e-324 needs about 1216 bits to store all its digits.
        using BigIntSys  = BigInt<SystemIntType, ((Info_T::Bias + 1U) + (number_size * 8U * 3U))>;
        using DigitConst = DigitUtils::DigitConst<BigIntSys::SizeOfType()>;

        const Number_T bias = (number & Info_T::ExponentMask);

        if (bias != Info_T::ExponentMask) {
            if ((number & Info_T::SignMask) != 0) {
                stream += DigitUtils::DigitChar::Negative;
            }

            Number_T mantissa = (number & Info_T::MantissaMask);

            if ((mantissa != 0) || (bias != 0)) {
                if (bias != 0) {
                    mantissa |= Info_T::LeadingBit;
                } else {
                    mantissa <<= 1U;
                }

                BigIntSys b_int{mantissa};
                /////////////////////////////////////
                const SizeT32 first_shift      = Platform::FindFirstBit(mantissa);
                const int     exponent         = (int)((bias >> Info_T::MantissaSize) - Info_T::Bias);
                const bool    is_positive_exp  = (exponent >= 0);
                const SizeT32 positive_exp     = SizeT32(is_positive_exp ? exponent : -exponent);
                const SizeT32 first_bit        = (Info_T::MantissaSize - first_shift);
                const SizeT32 exp_actual_value = (positive_exp + ((bias == 0) * first_bit));
                const SizeT32 digits           = (((exp_actual_value * 30103U) / 100000) + 1U);
                SizeT32       fraction_length  = 0;
                const bool    fixed =
                    ((format.Type == RealFormatType::SemiFixed) | (format.Type == RealFormatType::Fixed));
                const bool extra_digits = ((digits > format.Precision) & !fixed);
                const bool big_offset   = (positive_exp >= first_bit);
                const bool no_fraction  = (is_positive_exp & (big_offset | extra_digits));
                bool       round_up     = false;
                /////////////////////////////////////
                if (no_fraction) {
                    const SizeT32 drop    = ((!extra_digits) ? 0 : (digits - (format.Precision + 1U)));
                    const SizeT32 m_shift = (Info_T::MantissaSize + drop);

                    if (m_shift < positive_exp) {
                        b_int <<= (positive_exp - m_shift);
                    } else {
                        b_int >>= (m_shift - positive_exp);
                    }

                    if (drop != 0) {
                        round_up = true;
                        bigIntDropDigits(b_int, drop);
                    }
                } else {
                    SizeT32 shift   = 0;
                    SizeT32 needed  = 0;
                    fraction_length = first_bit;

                    if (is_positive_exp) {
                        fraction_length -= positive_exp;

                        if (fixed) {
                            needed = format.Precision;
                        } else {
                            needed = (format.Precision - digits);
                        }
                    } else {
                        fraction_length += positive_exp;
                        needed = (digits + format.Precision);
                    }

                    ++needed; // For rounding.

                    if (fraction_length > needed) {
                        shift           = (fraction_length - needed);
                        fraction_length = needed;
                        round_up        = true;
                    }

                    b_int >>= first_shift;

                    SizeT32 times = fraction_length;

                    if (times >= DigitConst::MaxPowerOfFive) {
                        const SizeT32 max_index = (format.Precision < Info_T::MaxCut)
                                                      ? ((format.Precision / DigitConst::MaxPowerOfTen) + 2U)
                                                      : b_int.MaxIndex();

                        do {
                            b_int *= DigitConst::GetPowerOfFive(DigitConst::MaxPowerOfFive);

                            if ((b_int.Index() >= max_index) && (shift >= DigitConst::MaxShift)) {
                                b_int >>= DigitConst::MaxShift;
                                shift -= DigitConst::MaxShift;
                            }

                            times -= DigitConst::MaxPowerOfFive;
                        } while (times >= DigitConst::MaxPowerOfFive);
                    }

                    if (times != 0) {
                        b_int *= DigitConst::GetPowerOfFive(times);
                    }

                    b_int >>= shift;
                }

                const SizeT start_at = stream.Length();
                bigIntToString(stream, b_int);

                switch (format.Type) {
                    case RealFormatType::SemiFixed: {
                        formatStringNumberFixed<false>(stream, start_at, format.Precision, digits, fraction_length,
                                                       round_up);
                        break;
                    }

                    case RealFormatType::Fixed: {
                        formatStringNumberFixed<true>(stream, start_at, format.Precision, digits, fraction_length,
                                                      round_up);
                        break;
                    }

                    default: {
                        formatStringNumberDefault(stream, start_at, format.Precision, digits, fraction_length,
                                                  is_positive_exp, round_up);
                    }
                }

            } else {
                stream += DigitUtils::DigitChar::Zero;

                if (format.Type == RealFormatType::Fixed) {
                    stream += DigitUtils::DigitChar::Dot;
                    insertZerosLarge(stream, format.Precision);
                }
            }
        } else {
            using Char_T           = typename Stream_T::CharType;
            constexpr SizeT32 size = sizeof(Char_T);
            using DigitString      = DigitUtils::DigitString<Char_T, size>;

            if ((number & Info_T::MantissaMask) == 0) {
                if ((number & Info_T::SignMask) != 0) {
                    stream += DigitUtils::DigitChar::Negative;
                }

                stream.Write(DigitString::Infinity, DigitString::InfinityLength);
            } else {
                stream.Write(DigitString::NotANumber, DigitString::NotANumberLength);
            }
        }
    }